

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.c
# Opt level: O3

void PredictReturnType(ASTNode *node)

{
  ASTNode *pAVar1;
  _Bool _Var2;
  Token TVar3;
  
  if (node->type == RETURN) {
    pAVar1 = (node->meta).binaryExpr.left;
    if (pAVar1 == (ASTNode *)0x0) {
      TVar3 = UNDEFINED;
    }
    else {
      _Var2 = IsNumber(pAVar1->type);
      if ((_Var2) || (_Var2 = IsString(pAVar1->type), _Var2)) {
        TVar3 = pAVar1->type;
      }
      else {
        if (pAVar1->type != BINARY) {
          return;
        }
        TVar3 = GetBinaryType((node->meta).binaryExpr.left);
      }
    }
    (node->meta).returnStmt.type = TVar3;
  }
  return;
}

Assistant:

void PredictReturnType(ASTNode* node){
	DEBUG_PRINT("Predicting return type");

	if (node->type != RETURN) return;

	ASTNode* value = GET_RETURN_VALUE(node);
	if (value == NULL){
		DEBUG_PRINT("Return type is undefined");
		SET_RETURN_TYPE(node, UNDEFINED);
	}
	else if (IsNumber(value->type) || IsString(value->type)){
		SET_RETURN_TYPE(node, value->type);
		DEBUG_PRINT2("Return Type Set", TokenToString(value->type));
	}
	else if (value->type == BINARY){
		SET_RETURN_TYPE(node, GetBinaryType(GET_RETURN_VALUE(node)));
		DEBUG_PRINT2("Return Type Set", TokenToString(GET_RETURN_TYPE(node)));
	}
}